

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

bool __thiscall wasm::anon_unknown_0::RecGroupEquator::eq(RecGroupEquator *this,Type a,Type b)

{
  int iVar1;
  uintptr_t *puVar2;
  bool bVar3;
  uintptr_t *puVar4;
  uintptr_t *puVar5;
  bool bVar6;
  
  if (b.id < 7 || a.id < 7) {
    bVar6 = a.id == b.id;
  }
  else {
    iVar1 = *(int *)(a.id + 4);
    if (iVar1 == *(int *)(b.id + 4)) {
      if (iVar1 == 1) {
        if (*(int *)(a.id + 0x10) == *(int *)(b.id + 0x10)) {
          bVar6 = eq(this,(HeapType)*(uintptr_t *)(a.id + 8),(HeapType)*(uintptr_t *)(b.id + 8));
          return bVar6;
        }
      }
      else {
        if (iVar1 != 0) {
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                             ,0x8be);
        }
        puVar5 = *(uintptr_t **)(a.id + 8);
        puVar2 = *(uintptr_t **)(a.id + 0x10);
        puVar4 = *(uintptr_t **)(b.id + 8);
        if ((long)puVar2 - (long)puVar5 == *(long *)(b.id + 0x10) - (long)puVar4) {
          bVar6 = puVar5 == puVar2;
          if (bVar6) {
            return bVar6;
          }
          bVar3 = eq(this,(Type)*puVar5,(Type)*puVar4);
          if (!bVar3) {
            return bVar6;
          }
          do {
            puVar5 = puVar5 + 1;
            puVar4 = puVar4 + 1;
            bVar6 = puVar5 == puVar2;
            if (bVar6) {
              return bVar6;
            }
            bVar3 = eq(this,(Type)*puVar5,(Type)*puVar4);
          } while (bVar3);
          return bVar6;
        }
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool RecGroupEquator::eq(Type a, Type b) const {
  if (a.isBasic() || b.isBasic()) {
    return a == b;
  }
  return eq(*getTypeInfo(a), *getTypeInfo(b));
}